

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  Scene *pSVar7;
  Ref<embree::Geometry> *pRVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  byte bVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  uint uVar57;
  AABBNodeMB4D *node1;
  ulong uVar58;
  long lVar59;
  long lVar60;
  int iVar61;
  undefined1 (*pauVar62) [16];
  long lVar63;
  ulong uVar64;
  ulong uVar65;
  long lVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  long lVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  undefined1 (*pauVar77) [16];
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar91;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar89;
  float fVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar88 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar103;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar127;
  undefined1 auVar126 [64];
  float fVar134;
  undefined1 auVar129 [16];
  float fVar128;
  undefined1 auVar130 [32];
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar131 [64];
  float fVar138;
  undefined1 auVar139 [32];
  float fVar141;
  float fVar142;
  uint uVar143;
  float fVar144;
  float fVar145;
  uint uVar146;
  float fVar147;
  uint uVar148;
  float fVar149;
  uint uVar150;
  float fVar151;
  uint uVar152;
  uint uVar153;
  undefined1 auVar140 [64];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar161 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar181 [32];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [64];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_29a0 [32];
  float local_2970;
  float fStack_296c;
  float fStack_2968;
  float fStack_2964;
  float local_2960;
  float fStack_295c;
  float fStack_2958;
  float fStack_2954;
  undefined1 local_2950 [16];
  undefined1 (*local_2940) [16];
  ulong local_2938;
  long local_2930;
  ulong local_2928;
  ulong local_2920;
  ulong local_2918;
  long local_2910;
  ulong local_2908;
  ulong local_2900;
  ulong local_28f8;
  ulong local_28f0;
  ulong local_28e8;
  undefined1 local_28e0 [32];
  RTCFilterFunctionNArguments local_28b0;
  undefined1 local_2880 [32];
  undefined1 local_2860 [8];
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  undefined4 uStack_2844;
  undefined1 local_2840 [32];
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  undefined1 local_2810 [8];
  float fStack_2808;
  float fStack_2804;
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  undefined1 local_27f0 [8];
  float fStack_27e8;
  float fStack_27e4;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  undefined1 local_27d0 [8];
  float fStack_27c8;
  float fStack_27c4;
  undefined1 local_27c0 [8];
  float fStack_27b8;
  float fStack_27b4;
  undefined1 local_27b0 [8];
  float fStack_27a8;
  float fStack_27a4;
  undefined1 local_27a0 [8];
  float fStack_2798;
  float fStack_2794;
  undefined1 local_2790 [16];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  RTCHitN local_2750 [16];
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined4 local_2710;
  undefined4 uStack_270c;
  undefined4 uStack_2708;
  undefined4 uStack_2704;
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  uint local_26e0;
  uint uStack_26dc;
  uint uStack_26d8;
  uint uStack_26d4;
  uint uStack_26d0;
  uint uStack_26cc;
  uint uStack_26c8;
  uint uStack_26c4;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  undefined4 uStack_2604;
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  undefined4 uStack_25e4;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined4 uStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined4 uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  undefined1 auVar113 [64];
  
  pauVar77 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23e0._4_4_ = uVar3;
  local_23e0._0_4_ = uVar3;
  local_23e0._8_4_ = uVar3;
  local_23e0._12_4_ = uVar3;
  local_23e0._16_4_ = uVar3;
  local_23e0._20_4_ = uVar3;
  local_23e0._24_4_ = uVar3;
  local_23e0._28_4_ = uVar3;
  auVar126 = ZEXT3264(local_23e0);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2400._4_4_ = uVar3;
  local_2400._0_4_ = uVar3;
  local_2400._8_4_ = uVar3;
  local_2400._12_4_ = uVar3;
  local_2400._16_4_ = uVar3;
  local_2400._20_4_ = uVar3;
  local_2400._24_4_ = uVar3;
  local_2400._28_4_ = uVar3;
  auVar131 = ZEXT3264(local_2400);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2420._4_4_ = uVar3;
  local_2420._0_4_ = uVar3;
  local_2420._8_4_ = uVar3;
  local_2420._12_4_ = uVar3;
  local_2420._16_4_ = uVar3;
  local_2420._20_4_ = uVar3;
  local_2420._24_4_ = uVar3;
  local_2420._28_4_ = uVar3;
  auVar140 = ZEXT3264(local_2420);
  fVar78 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar90 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar75 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar72 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar76 = uVar75 ^ 0x20;
  iVar61 = (tray->tnear).field_0.i[k];
  local_24a0._4_4_ = iVar61;
  local_24a0._0_4_ = iVar61;
  local_24a0._8_4_ = iVar61;
  local_24a0._12_4_ = iVar61;
  local_24a0._16_4_ = iVar61;
  local_24a0._20_4_ = iVar61;
  local_24a0._24_4_ = iVar61;
  local_24a0._28_4_ = iVar61;
  auVar182 = ZEXT3264(local_24a0);
  iVar61 = (tray->tfar).field_0.i[k];
  auVar88 = ZEXT3264(CONCAT428(iVar61,CONCAT424(iVar61,CONCAT420(iVar61,CONCAT416(iVar61,CONCAT412(
                                                  iVar61,CONCAT48(iVar61,CONCAT44(iVar61,iVar61)))))
                                               )));
  local_24c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24c0._0_16_ = mm_lookupmask_ps._0_16_;
  local_2940 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = 0x3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar110._16_4_ = 0x3f800000;
  auVar110._20_4_ = 0x3f800000;
  auVar110._24_4_ = 0x3f800000;
  auVar110._28_4_ = 0x3f800000;
  auVar113 = ZEXT3264(auVar110);
  auVar96._8_4_ = 0xbf800000;
  auVar96._0_8_ = 0xbf800000bf800000;
  auVar96._12_4_ = 0xbf800000;
  auVar96._16_4_ = 0xbf800000;
  auVar96._20_4_ = 0xbf800000;
  auVar96._24_4_ = 0xbf800000;
  auVar96._28_4_ = 0xbf800000;
  _local_24e0 = vblendvps_avx(auVar110,auVar96,local_24c0);
  local_2440 = fVar78;
  fStack_243c = fVar78;
  fStack_2438 = fVar78;
  fStack_2434 = fVar78;
  fStack_2430 = fVar78;
  fStack_242c = fVar78;
  fStack_2428 = fVar78;
  fStack_2424 = fVar78;
  local_2460 = fVar89;
  fStack_245c = fVar89;
  fStack_2458 = fVar89;
  fStack_2454 = fVar89;
  fStack_2450 = fVar89;
  fStack_244c = fVar89;
  fStack_2448 = fVar89;
  fStack_2444 = fVar89;
  local_2480 = fVar90;
  fStack_247c = fVar90;
  fStack_2478 = fVar90;
  fStack_2474 = fVar90;
  fStack_2470 = fVar90;
  fStack_246c = fVar90;
  fStack_2468 = fVar90;
  fStack_2464 = fVar90;
  fVar91 = fVar78;
  fVar92 = fVar78;
  fVar93 = fVar78;
  fVar94 = fVar78;
  fVar103 = fVar78;
  fVar127 = fVar78;
  fVar162 = fVar89;
  fVar144 = fVar89;
  fVar163 = fVar89;
  fVar164 = fVar89;
  fVar165 = fVar89;
  fVar166 = fVar89;
  fVar168 = fVar90;
  fVar170 = fVar90;
  fVar172 = fVar90;
  fVar174 = fVar90;
  fVar176 = fVar90;
  fVar178 = fVar90;
  local_2938 = uVar75;
LAB_010019ac:
  do {
    do {
      if (pauVar77 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar62 = pauVar77 + -1;
      auVar102 = ZEXT464((uint)*(float *)(*pauVar62 + 8));
      pauVar77 = pauVar77 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar62 + 8));
    uVar64 = *(ulong *)*pauVar77;
    while ((uVar64 & 8) == 0) {
      uVar58 = uVar64 & 0xfffffffffffffff0;
      fVar4 = *(float *)(ray + k * 4 + 0x70);
      auVar106._4_4_ = fVar4;
      auVar106._0_4_ = fVar4;
      auVar106._8_4_ = fVar4;
      auVar106._12_4_ = fVar4;
      auVar106._16_4_ = fVar4;
      auVar106._20_4_ = fVar4;
      auVar106._24_4_ = fVar4;
      auVar106._28_4_ = fVar4;
      pfVar2 = (float *)(uVar58 + 0x100 + uVar75);
      pfVar1 = (float *)(uVar58 + 0x40 + uVar75);
      auVar97._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar97._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar97._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar97._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar97._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
      auVar97._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
      auVar97._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
      auVar97._28_4_ = auVar102._28_4_ + pfVar1[7];
      auVar96 = vsubps_avx(auVar97,auVar126._0_32_);
      auVar29._4_4_ = fVar91 * auVar96._4_4_;
      auVar29._0_4_ = fVar78 * auVar96._0_4_;
      auVar29._8_4_ = fVar92 * auVar96._8_4_;
      auVar29._12_4_ = fVar93 * auVar96._12_4_;
      auVar29._16_4_ = fVar94 * auVar96._16_4_;
      auVar29._20_4_ = fVar103 * auVar96._20_4_;
      auVar29._24_4_ = fVar127 * auVar96._24_4_;
      auVar29._28_4_ = auVar96._28_4_;
      auVar96 = vmaxps_avx(auVar182._0_32_,auVar29);
      pfVar2 = (float *)(uVar58 + 0x100 + uVar65);
      pfVar1 = (float *)(uVar58 + 0x40 + uVar65);
      auVar111._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar111._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar111._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar111._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar111._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
      auVar111._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
      auVar111._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
      auVar111._28_4_ = auVar113._28_4_ + pfVar1[7];
      auVar110 = vsubps_avx(auVar111,auVar131._0_32_);
      auVar30._4_4_ = fVar162 * auVar110._4_4_;
      auVar30._0_4_ = fVar89 * auVar110._0_4_;
      auVar30._8_4_ = fVar144 * auVar110._8_4_;
      auVar30._12_4_ = fVar163 * auVar110._12_4_;
      auVar30._16_4_ = fVar164 * auVar110._16_4_;
      auVar30._20_4_ = fVar165 * auVar110._20_4_;
      auVar30._24_4_ = fVar166 * auVar110._24_4_;
      auVar30._28_4_ = auVar110._28_4_;
      pfVar2 = (float *)(uVar58 + 0x100 + uVar72);
      pfVar1 = (float *)(uVar58 + 0x40 + uVar72);
      auVar116._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar116._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar116._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar116._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar116._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
      auVar116._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
      auVar116._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
      auVar116._28_4_ = in_ZMM4._28_4_ + pfVar1[7];
      auVar29 = vsubps_avx(auVar116,auVar140._0_32_);
      auVar31._4_4_ = fVar168 * auVar29._4_4_;
      auVar31._0_4_ = fVar90 * auVar29._0_4_;
      auVar31._8_4_ = fVar170 * auVar29._8_4_;
      auVar31._12_4_ = fVar172 * auVar29._12_4_;
      auVar31._16_4_ = fVar174 * auVar29._16_4_;
      auVar31._20_4_ = fVar176 * auVar29._20_4_;
      auVar31._24_4_ = fVar178 * auVar29._24_4_;
      auVar31._28_4_ = auVar29._28_4_;
      auVar110 = vmaxps_avx(auVar30,auVar31);
      local_26c0 = vmaxps_avx(auVar96,auVar110);
      pfVar2 = (float *)(uVar58 + 0x100 + uVar76);
      pfVar1 = (float *)(uVar58 + 0x40 + uVar76);
      auVar112._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar112._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar112._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar112._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar112._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
      auVar112._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
      auVar112._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
      auVar112._28_4_ = auVar110._28_4_ + pfVar1[7];
      auVar96 = vsubps_avx(auVar112,auVar126._0_32_);
      auVar32._4_4_ = fVar91 * auVar96._4_4_;
      auVar32._0_4_ = fVar78 * auVar96._0_4_;
      auVar32._8_4_ = fVar92 * auVar96._8_4_;
      auVar32._12_4_ = fVar93 * auVar96._12_4_;
      auVar32._16_4_ = fVar94 * auVar96._16_4_;
      auVar32._20_4_ = fVar103 * auVar96._20_4_;
      auVar32._24_4_ = fVar127 * auVar96._24_4_;
      auVar32._28_4_ = auVar96._28_4_;
      pfVar2 = (float *)(uVar58 + 0x100 + (uVar65 ^ 0x20));
      auVar96 = vminps_avx(auVar88._0_32_,auVar32);
      pfVar1 = (float *)(uVar58 + 0x40 + (uVar65 ^ 0x20));
      auVar117._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar117._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar117._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar117._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar117._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
      auVar117._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
      auVar117._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
      auVar117._28_4_ = auVar29._28_4_ + pfVar1[7];
      auVar110 = vsubps_avx(auVar117,auVar131._0_32_);
      pfVar2 = (float *)(uVar58 + 0x100 + (uVar72 ^ 0x20));
      pfVar1 = (float *)(uVar58 + 0x40 + (uVar72 ^ 0x20));
      auVar120._0_4_ = fVar4 * *pfVar2 + *pfVar1;
      auVar120._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
      auVar120._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
      auVar120._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
      auVar120._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
      auVar120._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
      auVar120._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
      auVar120._28_4_ = in_ZMM5._28_4_ + pfVar1[7];
      auVar33._4_4_ = fVar162 * auVar110._4_4_;
      auVar33._0_4_ = fVar89 * auVar110._0_4_;
      auVar33._8_4_ = fVar144 * auVar110._8_4_;
      auVar33._12_4_ = fVar163 * auVar110._12_4_;
      auVar33._16_4_ = fVar164 * auVar110._16_4_;
      auVar33._20_4_ = fVar165 * auVar110._20_4_;
      auVar33._24_4_ = fVar166 * auVar110._24_4_;
      auVar33._28_4_ = auVar110._28_4_;
      auVar110 = vsubps_avx(auVar120,auVar140._0_32_);
      auVar40._4_4_ = fVar168 * auVar110._4_4_;
      auVar40._0_4_ = fVar90 * auVar110._0_4_;
      auVar40._8_4_ = fVar170 * auVar110._8_4_;
      auVar40._12_4_ = fVar172 * auVar110._12_4_;
      auVar40._16_4_ = fVar174 * auVar110._16_4_;
      auVar40._20_4_ = fVar176 * auVar110._20_4_;
      auVar40._24_4_ = fVar178 * auVar110._24_4_;
      auVar40._28_4_ = auVar110._28_4_;
      in_ZMM5 = ZEXT3264(auVar40);
      auVar110 = vminps_avx(auVar33,auVar40);
      auVar96 = vminps_avx(auVar96,auVar110);
      auVar96 = vcmpps_avx(local_26c0,auVar96,2);
      auVar113 = ZEXT3264(auVar96);
      if (((uint)uVar64 & 7) == 6) {
        auVar110 = vcmpps_avx(*(undefined1 (*) [32])(uVar58 + 0x1c0),auVar106,2);
        auVar29 = vcmpps_avx(auVar106,*(undefined1 (*) [32])(uVar58 + 0x1e0),1);
        auVar29 = vandps_avx(auVar110,auVar29);
        auVar96 = vandps_avx(auVar29,auVar96);
        auVar113 = ZEXT1664(auVar96._16_16_);
        auVar104 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
      }
      else {
        auVar104 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
      }
      in_ZMM4 = ZEXT3264(auVar110);
      auVar104 = vpsllw_avx(auVar104,0xf);
      if ((((((((auVar104 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar104 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar104 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar104 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar104 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar104 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar104 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar104[0xf]
         ) goto LAB_010019ac;
      auVar104 = vpacksswb_avx(auVar104,auVar104);
      auVar102 = ZEXT1664(auVar104);
      bVar39 = SUB161(auVar104 >> 7,0) & 1 | (SUB161(auVar104 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar104 >> 0x17,0) & 1) << 2 | (SUB161(auVar104 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar104 >> 0x27,0) & 1) << 4 | (SUB161(auVar104 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar104 >> 0x37,0) & 1) << 6 | SUB161(auVar104 >> 0x3f,0) << 7;
      lVar59 = 0;
      if (bVar39 != 0) {
        for (; (bVar39 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
        }
      }
      uVar64 = *(ulong *)(uVar58 + lVar59 * 8);
      uVar67 = bVar39 - 1 & (uint)bVar39;
      if (uVar67 != 0) {
        uVar57 = *(uint *)(local_26c0 + lVar59 * 4);
        lVar59 = 0;
        if (uVar67 != 0) {
          for (; (uVar67 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
          }
        }
        uVar68 = *(ulong *)(uVar58 + lVar59 * 8);
        uVar143 = *(uint *)(local_26c0 + lVar59 * 4);
        uVar67 = uVar67 - 1 & uVar67;
        if (uVar67 == 0) {
          if (uVar57 < uVar143) {
            *(ulong *)*pauVar77 = uVar68;
            *(uint *)(*pauVar77 + 8) = uVar143;
            pauVar77 = pauVar77 + 1;
          }
          else {
            *(ulong *)*pauVar77 = uVar64;
            *(uint *)(*pauVar77 + 8) = uVar57;
            uVar64 = uVar68;
            pauVar77 = pauVar77 + 1;
          }
        }
        else {
          auVar104._8_8_ = 0;
          auVar104._0_8_ = uVar64;
          auVar104 = vpunpcklqdq_avx(auVar104,ZEXT416(uVar57));
          auVar95._8_8_ = 0;
          auVar95._0_8_ = uVar68;
          auVar95 = vpunpcklqdq_avx(auVar95,ZEXT416(uVar143));
          lVar59 = 0;
          if (uVar67 != 0) {
            for (; (uVar67 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
            }
          }
          auVar80._8_8_ = 0;
          auVar80._0_8_ = *(ulong *)(uVar58 + lVar59 * 8);
          auVar129 = vpunpcklqdq_avx(auVar80,ZEXT416(*(uint *)(local_26c0 + lVar59 * 4)));
          auVar113 = ZEXT1664(auVar129);
          auVar80 = vpcmpgtd_avx(auVar95,auVar104);
          in_ZMM4 = ZEXT1664(auVar80);
          uVar67 = uVar67 - 1 & uVar67;
          if (uVar67 == 0) {
            auVar118 = vpshufd_avx(auVar80,0xaa);
            auVar80 = vblendvps_avx(auVar95,auVar104,auVar118);
            auVar104 = vblendvps_avx(auVar104,auVar95,auVar118);
            auVar95 = vpcmpgtd_avx(auVar129,auVar80);
            auVar118 = vpshufd_avx(auVar95,0xaa);
            auVar95 = vblendvps_avx(auVar129,auVar80,auVar118);
            in_ZMM4 = ZEXT1664(auVar95);
            auVar80 = vblendvps_avx(auVar80,auVar129,auVar118);
            auVar129 = vpcmpgtd_avx(auVar80,auVar104);
            auVar118 = vpshufd_avx(auVar129,0xaa);
            auVar113 = ZEXT1664(auVar118);
            auVar129 = vblendvps_avx(auVar80,auVar104,auVar118);
            in_ZMM5 = ZEXT1664(auVar129);
            auVar104 = vblendvps_avx(auVar104,auVar80,auVar118);
            auVar102 = ZEXT1664(auVar104);
            *pauVar77 = auVar104;
            pauVar77[1] = auVar129;
            uVar64 = auVar95._0_8_;
            pauVar77 = pauVar77 + 2;
          }
          else {
            lVar59 = 0;
            if (uVar67 != 0) {
              for (; (uVar67 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
              }
            }
            auVar118._8_8_ = 0;
            auVar118._0_8_ = *(ulong *)(uVar58 + lVar59 * 8);
            auVar118 = vpunpcklqdq_avx(auVar118,ZEXT416(*(uint *)(local_26c0 + lVar59 * 4)));
            in_ZMM5 = ZEXT1664(auVar118);
            uVar67 = uVar67 - 1 & uVar67;
            uVar64 = (ulong)uVar67;
            if (uVar67 == 0) {
              auVar79 = vpshufd_avx(auVar80,0xaa);
              auVar80 = vblendvps_avx(auVar95,auVar104,auVar79);
              auVar104 = vblendvps_avx(auVar104,auVar95,auVar79);
              auVar95 = vpcmpgtd_avx(auVar118,auVar129);
              auVar79 = vpshufd_avx(auVar95,0xaa);
              auVar95 = vblendvps_avx(auVar118,auVar129,auVar79);
              auVar129 = vblendvps_avx(auVar129,auVar118,auVar79);
              auVar118 = vpcmpgtd_avx(auVar129,auVar104);
              auVar79 = vpshufd_avx(auVar118,0xaa);
              auVar118 = vblendvps_avx(auVar129,auVar104,auVar79);
              in_ZMM5 = ZEXT1664(auVar118);
              auVar104 = vblendvps_avx(auVar104,auVar129,auVar79);
              auVar102 = ZEXT1664(auVar104);
              auVar129 = vpcmpgtd_avx(auVar95,auVar80);
              auVar79 = vpshufd_avx(auVar129,0xaa);
              auVar129 = vblendvps_avx(auVar95,auVar80,auVar79);
              auVar113 = ZEXT1664(auVar129);
              auVar95 = vblendvps_avx(auVar80,auVar95,auVar79);
              auVar80 = vpcmpgtd_avx(auVar118,auVar95);
              auVar79 = vpshufd_avx(auVar80,0xaa);
              in_ZMM4 = ZEXT1664(auVar79);
              auVar80 = vblendvps_avx(auVar118,auVar95,auVar79);
              auVar95 = vblendvps_avx(auVar95,auVar118,auVar79);
              *pauVar77 = auVar104;
              pauVar77[1] = auVar95;
              pauVar77[2] = auVar80;
              uVar64 = auVar129._0_8_;
              pauVar77 = pauVar77 + 3;
            }
            else {
              *pauVar77 = auVar104;
              pauVar77[1] = auVar95;
              pauVar77[2] = auVar129;
              pauVar62 = pauVar77 + 3;
              pauVar77[3] = auVar118;
              do {
                lVar59 = 0;
                if (uVar64 != 0) {
                  for (; (uVar64 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                  }
                }
                auVar129._8_8_ = 0;
                auVar129._0_8_ = *(ulong *)(uVar58 + lVar59 * 8);
                auVar104 = vpunpcklqdq_avx(auVar129,ZEXT416(*(uint *)(local_26c0 + lVar59 * 4)));
                pauVar62[1] = auVar104;
                pauVar62 = pauVar62 + 1;
                uVar64 = uVar64 & uVar64 - 1;
              } while (uVar64 != 0);
              lVar59 = 0;
              while (auVar102 = ZEXT1664(auVar104), pauVar62 != pauVar77) {
                auVar104 = pauVar77[1];
                uVar67 = vextractps_avx(auVar104,2);
                for (lVar66 = 0x10;
                    (lVar59 != lVar66 && (*(uint *)(pauVar77[-1] + lVar66 + 8) < uVar67));
                    lVar66 = lVar66 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar77 + lVar66) =
                       *(undefined1 (*) [16])(pauVar77[-1] + lVar66);
                }
                *(undefined1 (*) [16])(*pauVar77 + lVar66) = auVar104;
                lVar59 = lVar59 + -0x10;
                pauVar77 = pauVar77 + 1;
              }
              uVar64 = *(ulong *)*pauVar62;
              pauVar77 = pauVar62;
            }
          }
        }
      }
    }
    local_2930 = (ulong)((uint)uVar64 & 0xf) - 8;
    uVar64 = uVar64 & 0xfffffffffffffff0;
    for (lVar59 = 0; lVar59 != local_2930; lVar59 = lVar59 + 1) {
      lVar60 = lVar59 * 0x60;
      pSVar7 = context->scene;
      pRVar8 = (pSVar7->geometries).items;
      pGVar9 = pRVar8[*(uint *)(uVar64 + 0x40 + lVar60)].ptr;
      fVar78 = (pGVar9->time_range).lower;
      fVar78 = pGVar9->fnumTimeSegments *
               ((*(float *)(ray + k * 4 + 0x70) - fVar78) / ((pGVar9->time_range).upper - fVar78));
      auVar104 = vroundss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78),9);
      auVar104 = vminss_avx(auVar104,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar189 = vmaxss_avx(ZEXT816(0) << 0x20,auVar104);
      iVar61 = (int)auVar189._0_4_;
      lVar73 = (long)iVar61 * 0x38;
      lVar66 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar73);
      local_2900 = (ulong)*(uint *)(uVar64 + 4 + lVar60);
      auVar104 = *(undefined1 (*) [16])(lVar66 + (ulong)*(uint *)(uVar64 + lVar60) * 4);
      uVar58 = (ulong)*(uint *)(uVar64 + 0x10 + lVar60);
      auVar95 = *(undefined1 (*) [16])(lVar66 + uVar58 * 4);
      uVar68 = (ulong)*(uint *)(uVar64 + 0x20 + lVar60);
      auVar80 = *(undefined1 (*) [16])(lVar66 + uVar68 * 4);
      uVar69 = (ulong)*(uint *)(uVar64 + 0x30 + lVar60);
      auVar129 = *(undefined1 (*) [16])(lVar66 + uVar69 * 4);
      local_2910 = *(long *)&pRVar8[*(uint *)(uVar64 + 0x44 + lVar60)].ptr[2].numPrimitives;
      lVar66 = *(long *)(local_2910 + lVar73);
      auVar118 = *(undefined1 (*) [16])(lVar66 + local_2900 * 4);
      local_28f0 = (ulong)*(uint *)(uVar64 + 0x14 + lVar60);
      auVar79 = *(undefined1 (*) [16])(lVar66 + local_28f0 * 4);
      local_28e8 = (ulong)*(uint *)(uVar64 + 0x24 + lVar60);
      auVar114 = *(undefined1 (*) [16])(lVar66 + local_28e8 * 4);
      uVar70 = (ulong)*(uint *)(uVar64 + 0x34 + lVar60);
      auVar115 = *(undefined1 (*) [16])(lVar66 + uVar70 * 4);
      lVar66 = *(long *)&pRVar8[*(uint *)(uVar64 + 0x48 + lVar60)].ptr[2].numPrimitives;
      lVar10 = *(long *)(lVar66 + lVar73);
      uVar71 = (ulong)*(uint *)(uVar64 + 8 + lVar60);
      auVar119 = *(undefined1 (*) [16])(lVar10 + uVar71 * 4);
      local_2918 = (ulong)*(uint *)(uVar64 + 0x18 + lVar60);
      auVar105 = *(undefined1 (*) [16])(lVar10 + local_2918 * 4);
      local_2908 = (ulong)*(uint *)(uVar64 + 0x28 + lVar60);
      auVar123 = *(undefined1 (*) [16])(lVar10 + local_2908 * 4);
      local_28f8 = (ulong)*(uint *)(uVar64 + 0x38 + lVar60);
      auVar81 = *(undefined1 (*) [16])(lVar10 + local_28f8 * 4);
      fVar78 = fVar78 - auVar189._0_4_;
      local_2790 = ZEXT416((uint)fVar78);
      lVar10 = *(long *)&pRVar8[*(uint *)(uVar64 + 0x4c + lVar60)].ptr[2].numPrimitives;
      lVar73 = *(long *)(lVar10 + lVar73);
      uVar75 = (ulong)*(uint *)(uVar64 + 0xc + lVar60);
      auVar189 = *(undefined1 (*) [16])(lVar73 + uVar75 * 4);
      local_2928 = (ulong)*(uint *)(uVar64 + 0x1c + lVar60);
      auVar6 = *(undefined1 (*) [16])(lVar73 + local_2928 * 4);
      auVar34 = vunpcklps_avx(auVar104,auVar119);
      auVar119 = vunpckhps_avx(auVar104,auVar119);
      auVar35 = vunpcklps_avx(auVar118,auVar189);
      auVar118 = vunpckhps_avx(auVar118,auVar189);
      uVar74 = (ulong)*(uint *)(uVar64 + 0x2c + lVar60);
      auVar104 = *(undefined1 (*) [16])(lVar73 + uVar74 * 4);
      _local_27b0 = vunpcklps_avx(auVar119,auVar118);
      _local_27f0 = vunpcklps_avx(auVar34,auVar35);
      _local_27d0 = vunpckhps_avx(auVar34,auVar35);
      auVar119 = vunpcklps_avx(auVar95,auVar105);
      auVar118 = vunpckhps_avx(auVar95,auVar105);
      auVar105 = vunpcklps_avx(auVar79,auVar6);
      auVar79 = vunpckhps_avx(auVar79,auVar6);
      local_2920 = (ulong)*(uint *)(uVar64 + 0x3c + lVar60);
      auVar95 = *(undefined1 (*) [16])(lVar73 + local_2920 * 4);
      _local_27a0 = vunpcklps_avx(auVar118,auVar79);
      _local_27e0 = vunpcklps_avx(auVar119,auVar105);
      _local_27c0 = vunpckhps_avx(auVar119,auVar105);
      auVar79 = vunpcklps_avx(auVar80,auVar123);
      auVar80 = vunpckhps_avx(auVar80,auVar123);
      auVar119 = vunpcklps_avx(auVar114,auVar104);
      auVar118 = vunpckhps_avx(auVar114,auVar104);
      lVar63 = (long)(iVar61 + 1) * 0x38;
      lVar73 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar63);
      auVar104 = *(undefined1 (*) [16])(lVar73 + (ulong)*(uint *)(uVar64 + lVar60) * 4);
      auVar114 = vunpcklps_avx(auVar80,auVar118);
      _local_2820 = vunpcklps_avx(auVar79,auVar119);
      _local_2810 = vunpckhps_avx(auVar79,auVar119);
      auVar118 = vunpcklps_avx(auVar129,auVar81);
      auVar80 = vunpckhps_avx(auVar129,auVar81);
      auVar79 = vunpcklps_avx(auVar115,auVar95);
      auVar129 = vunpckhps_avx(auVar115,auVar95);
      lVar66 = *(long *)(lVar66 + lVar63);
      auVar95 = *(undefined1 (*) [16])(lVar66 + uVar71 * 4);
      auVar115 = vunpcklps_avx(auVar80,auVar129);
      auVar119 = vunpcklps_avx(auVar118,auVar79);
      _local_2800 = vunpckhps_avx(auVar118,auVar79);
      lVar11 = *(long *)(local_2910 + lVar63);
      auVar129 = vunpcklps_avx(auVar104,auVar95);
      auVar80 = vunpckhps_avx(auVar104,auVar95);
      auVar104 = *(undefined1 (*) [16])(lVar11 + local_2900 * 4);
      lVar10 = *(long *)(lVar10 + lVar63);
      auVar95 = *(undefined1 (*) [16])(lVar10 + uVar75 * 4);
      auVar118 = vunpcklps_avx(auVar104,auVar95);
      auVar104 = vunpckhps_avx(auVar104,auVar95);
      auVar105 = vunpcklps_avx(auVar80,auVar104);
      auVar123 = vunpcklps_avx(auVar129,auVar118);
      auVar80 = vunpckhps_avx(auVar129,auVar118);
      auVar104 = *(undefined1 (*) [16])(lVar73 + uVar58 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar66 + local_2918 * 4);
      auVar118 = vunpcklps_avx(auVar104,auVar95);
      auVar129 = vunpckhps_avx(auVar104,auVar95);
      auVar104 = *(undefined1 (*) [16])(lVar11 + local_28f0 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar10 + local_2928 * 4);
      auVar79 = vunpcklps_avx(auVar104,auVar95);
      auVar104 = vunpckhps_avx(auVar104,auVar95);
      auVar81 = vunpcklps_avx(auVar129,auVar104);
      auVar189 = vunpcklps_avx(auVar118,auVar79);
      auVar129 = vunpckhps_avx(auVar118,auVar79);
      auVar104 = *(undefined1 (*) [16])(lVar73 + uVar68 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar66 + local_2908 * 4);
      auVar79 = vunpcklps_avx(auVar104,auVar95);
      auVar118 = vunpckhps_avx(auVar104,auVar95);
      auVar104 = *(undefined1 (*) [16])(lVar11 + local_28e8 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar10 + uVar74 * 4);
      auVar6 = vunpcklps_avx(auVar104,auVar95);
      auVar104 = vunpckhps_avx(auVar104,auVar95);
      auVar34 = vunpcklps_avx(auVar118,auVar104);
      auVar35 = vunpcklps_avx(auVar79,auVar6);
      auVar118 = vunpckhps_avx(auVar79,auVar6);
      auVar104 = *(undefined1 (*) [16])(lVar73 + uVar69 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar66 + local_28f8 * 4);
      auVar6 = vunpcklps_avx(auVar104,auVar95);
      auVar79 = vunpckhps_avx(auVar104,auVar95);
      auVar104 = *(undefined1 (*) [16])(lVar11 + uVar70 * 4);
      auVar95 = *(undefined1 (*) [16])(lVar10 + local_2920 * 4);
      auVar36 = vunpcklps_avx(auVar104,auVar95);
      auVar104 = vunpckhps_avx(auVar104,auVar95);
      auVar37 = vunpcklps_avx(auVar79,auVar104);
      auVar38 = vunpcklps_avx(auVar6,auVar36);
      auVar79 = vunpckhps_avx(auVar6,auVar36);
      auVar104 = vshufps_avx(local_2790,local_2790,0);
      auVar95 = ZEXT416((uint)(1.0 - fVar78));
      auVar95 = vshufps_avx(auVar95,auVar95,0);
      fVar78 = auVar104._0_4_;
      fVar89 = auVar104._4_4_;
      fVar90 = auVar104._8_4_;
      fVar91 = auVar104._12_4_;
      fVar92 = auVar95._0_4_;
      fVar93 = auVar95._4_4_;
      fVar94 = auVar95._8_4_;
      fVar103 = auVar95._12_4_;
      auVar122._4_4_ = fVar93 * (float)local_27f0._4_4_ + auVar123._4_4_ * fVar89;
      auVar122._0_4_ = fVar92 * (float)local_27f0._0_4_ + auVar123._0_4_ * fVar78;
      auVar122._8_4_ = fVar94 * fStack_27e8 + auVar123._8_4_ * fVar90;
      auVar122._12_4_ = fVar103 * fStack_27e4 + auVar123._12_4_ * fVar91;
      auVar130._4_4_ = fVar93 * (float)local_27d0._4_4_ + fVar89 * auVar80._4_4_;
      auVar130._0_4_ = fVar92 * (float)local_27d0._0_4_ + fVar78 * auVar80._0_4_;
      auVar130._8_4_ = fVar94 * fStack_27c8 + fVar90 * auVar80._8_4_;
      auVar130._12_4_ = fVar103 * fStack_27c4 + fVar91 * auVar80._12_4_;
      auVar161._4_4_ = fVar93 * (float)local_27b0._4_4_ + auVar105._4_4_ * fVar89;
      auVar161._0_4_ = fVar92 * (float)local_27b0._0_4_ + auVar105._0_4_ * fVar78;
      auVar161._8_4_ = fVar94 * fStack_27a8 + auVar105._8_4_ * fVar90;
      auVar161._12_4_ = fVar103 * fStack_27a4 + auVar105._12_4_ * fVar91;
      auVar123._0_4_ = fVar92 * (float)local_27e0._0_4_ + fVar78 * auVar189._0_4_;
      auVar123._4_4_ = fVar93 * (float)local_27e0._4_4_ + fVar89 * auVar189._4_4_;
      auVar123._8_4_ = fVar94 * fStack_27d8 + fVar90 * auVar189._8_4_;
      auVar123._12_4_ = fVar103 * fStack_27d4 + fVar91 * auVar189._12_4_;
      auVar105._0_4_ = fVar92 * (float)local_27c0._0_4_ + auVar129._0_4_ * fVar78;
      auVar105._4_4_ = fVar93 * (float)local_27c0._4_4_ + auVar129._4_4_ * fVar89;
      auVar105._8_4_ = fVar94 * fStack_27b8 + auVar129._8_4_ * fVar90;
      auVar105._12_4_ = fVar103 * fStack_27b4 + auVar129._12_4_ * fVar91;
      auVar189._0_4_ = fVar92 * (float)local_27a0._0_4_ + auVar81._0_4_ * fVar78;
      auVar189._4_4_ = fVar93 * (float)local_27a0._4_4_ + auVar81._4_4_ * fVar89;
      auVar189._8_4_ = fVar94 * fStack_2798 + auVar81._8_4_ * fVar90;
      auVar189._12_4_ = fVar103 * fStack_2794 + auVar81._12_4_ * fVar91;
      auVar122._20_4_ = fVar93 * (float)local_2820._4_4_ + fVar89 * auVar35._4_4_;
      auVar122._16_4_ = fVar92 * (float)local_2820._0_4_ + fVar78 * auVar35._0_4_;
      auVar122._24_4_ = fVar94 * fStack_2818 + fVar90 * auVar35._8_4_;
      auVar122._28_4_ = fVar103 * fStack_2814 + fVar91 * auVar35._12_4_;
      auVar130._20_4_ = fVar93 * (float)local_2810._4_4_ + auVar118._4_4_ * fVar89;
      auVar130._16_4_ = fVar92 * (float)local_2810._0_4_ + auVar118._0_4_ * fVar78;
      auVar130._24_4_ = fVar94 * fStack_2808 + auVar118._8_4_ * fVar90;
      auVar130._28_4_ = fVar103 * fStack_2804 + auVar118._12_4_ * fVar91;
      local_2960 = auVar114._0_4_;
      fStack_295c = auVar114._4_4_;
      fStack_2958 = auVar114._8_4_;
      fStack_2954 = auVar114._12_4_;
      auVar161._20_4_ = fVar93 * fStack_295c + auVar34._4_4_ * fVar89;
      auVar161._16_4_ = fVar92 * local_2960 + auVar34._0_4_ * fVar78;
      auVar161._24_4_ = fVar94 * fStack_2958 + auVar34._8_4_ * fVar90;
      fVar144 = fVar103 * fStack_2954 + auVar34._12_4_ * fVar91;
      auVar161._28_4_ = fVar144;
      lVar66 = uVar64 + 0x40 + lVar60;
      local_23c0 = *(undefined8 *)(lVar66 + 0x10);
      uStack_23b8 = *(undefined8 *)(lVar66 + 0x18);
      auVar114._0_4_ = auVar119._0_4_ * fVar92 + fVar78 * auVar38._0_4_;
      auVar114._4_4_ = auVar119._4_4_ * fVar93 + fVar89 * auVar38._4_4_;
      auVar114._8_4_ = auVar119._8_4_ * fVar94 + fVar90 * auVar38._8_4_;
      auVar114._12_4_ = auVar119._12_4_ * fVar103 + fVar91 * auVar38._12_4_;
      uStack_23b0 = local_23c0;
      uStack_23a8 = uStack_23b8;
      lVar60 = uVar64 + 0x50 + lVar60;
      local_2780 = *(undefined8 *)(lVar60 + 0x10);
      uStack_2778 = *(undefined8 *)(lVar60 + 0x18);
      auVar119._0_4_ = fVar92 * (float)local_2800._0_4_ + fVar78 * auVar79._0_4_;
      auVar119._4_4_ = fVar93 * (float)local_2800._4_4_ + fVar89 * auVar79._4_4_;
      auVar119._8_4_ = fVar94 * fStack_27f8 + fVar90 * auVar79._8_4_;
      auVar119._12_4_ = fVar103 * fStack_27f4 + fVar91 * auVar79._12_4_;
      local_2970 = auVar115._0_4_;
      fStack_296c = auVar115._4_4_;
      fStack_2968 = auVar115._8_4_;
      fStack_2964 = auVar115._12_4_;
      auVar79._0_4_ = fVar92 * local_2970 + fVar78 * auVar37._0_4_;
      auVar79._4_4_ = fVar93 * fStack_296c + fVar89 * auVar37._4_4_;
      auVar79._8_4_ = fVar94 * fStack_2968 + fVar90 * auVar37._8_4_;
      auVar79._12_4_ = fVar103 * fStack_2964 + fVar91 * auVar37._12_4_;
      uStack_2770 = local_2780;
      uStack_2768 = uStack_2778;
      auVar98._16_16_ = auVar123;
      auVar98._0_16_ = auVar123;
      auVar107._16_16_ = auVar105;
      auVar107._0_16_ = auVar105;
      auVar124._16_16_ = auVar189;
      auVar124._0_16_ = auVar189;
      auVar139._16_16_ = auVar114;
      auVar139._0_16_ = auVar114;
      auVar121._16_16_ = auVar119;
      auVar121._0_16_ = auVar119;
      auVar82._16_16_ = auVar79;
      auVar82._0_16_ = auVar79;
      auVar96 = vsubps_avx(auVar122,auVar98);
      auVar110 = vsubps_avx(auVar130,auVar107);
      auVar29 = vsubps_avx(auVar161,auVar124);
      auVar30 = vsubps_avx(auVar139,auVar122);
      auVar31 = vsubps_avx(auVar121,auVar130);
      auVar32 = vsubps_avx(auVar82,auVar161);
      fVar91 = auVar110._0_4_;
      fVar167 = auVar32._0_4_;
      fVar127 = auVar110._4_4_;
      fVar169 = auVar32._4_4_;
      auVar41._4_4_ = fVar169 * fVar127;
      auVar41._0_4_ = fVar167 * fVar91;
      fVar165 = auVar110._8_4_;
      fVar171 = auVar32._8_4_;
      auVar41._8_4_ = fVar171 * fVar165;
      fVar174 = auVar110._12_4_;
      fVar173 = auVar32._12_4_;
      auVar41._12_4_ = fVar173 * fVar174;
      fVar14 = auVar110._16_4_;
      fVar175 = auVar32._16_4_;
      auVar41._16_4_ = fVar175 * fVar14;
      fVar19 = auVar110._20_4_;
      fVar177 = auVar32._20_4_;
      auVar41._20_4_ = fVar177 * fVar19;
      fVar24 = auVar110._24_4_;
      fVar179 = auVar32._24_4_;
      auVar41._24_4_ = fVar179 * fVar24;
      auVar41._28_4_ = auVar79._12_4_;
      fVar92 = auVar29._0_4_;
      fVar154 = auVar31._0_4_;
      fVar162 = auVar29._4_4_;
      fVar155 = auVar31._4_4_;
      auVar42._4_4_ = fVar155 * fVar162;
      auVar42._0_4_ = fVar154 * fVar92;
      fVar166 = auVar29._8_4_;
      fVar156 = auVar31._8_4_;
      auVar42._8_4_ = fVar156 * fVar166;
      fVar176 = auVar29._12_4_;
      fVar157 = auVar31._12_4_;
      auVar42._12_4_ = fVar157 * fVar176;
      fVar15 = auVar29._16_4_;
      fVar158 = auVar31._16_4_;
      auVar42._16_4_ = fVar158 * fVar15;
      fVar20 = auVar29._20_4_;
      fVar159 = auVar31._20_4_;
      auVar42._20_4_ = fVar159 * fVar20;
      fVar25 = auVar29._24_4_;
      fVar160 = auVar31._24_4_;
      auVar42._24_4_ = fVar160 * fVar25;
      auVar42._28_4_ = auVar123._12_4_;
      local_2640 = vsubps_avx(auVar42,auVar41);
      fVar138 = auVar30._0_4_;
      fVar141 = auVar30._4_4_;
      auVar43._4_4_ = fVar141 * fVar162;
      auVar43._0_4_ = fVar138 * fVar92;
      fVar142 = auVar30._8_4_;
      auVar43._8_4_ = fVar142 * fVar166;
      fVar145 = auVar30._12_4_;
      auVar43._12_4_ = fVar145 * fVar176;
      fVar147 = auVar30._16_4_;
      auVar43._16_4_ = fVar147 * fVar15;
      fVar149 = auVar30._20_4_;
      auVar43._20_4_ = fVar149 * fVar20;
      fVar151 = auVar30._24_4_;
      auVar43._24_4_ = fVar151 * fVar25;
      auVar43._28_4_ = auVar123._12_4_;
      fVar180 = auVar96._0_4_;
      fVar183 = auVar96._4_4_;
      auVar44._4_4_ = fVar183 * fVar169;
      auVar44._0_4_ = fVar180 * fVar167;
      fVar184 = auVar96._8_4_;
      auVar44._8_4_ = fVar184 * fVar171;
      fVar185 = auVar96._12_4_;
      auVar44._12_4_ = fVar185 * fVar173;
      fVar186 = auVar96._16_4_;
      auVar44._16_4_ = fVar186 * fVar175;
      fVar187 = auVar96._20_4_;
      auVar44._20_4_ = fVar187 * fVar177;
      fVar188 = auVar96._24_4_;
      auVar44._24_4_ = fVar188 * fVar179;
      auVar44._28_4_ = auVar105._12_4_;
      auVar96 = vsubps_avx(auVar44,auVar43);
      auVar45._4_4_ = fVar183 * fVar155;
      auVar45._0_4_ = fVar180 * fVar154;
      auVar45._8_4_ = fVar184 * fVar156;
      auVar45._12_4_ = fVar185 * fVar157;
      auVar45._16_4_ = fVar186 * fVar158;
      auVar45._20_4_ = fVar187 * fVar159;
      auVar45._24_4_ = fVar188 * fVar160;
      auVar45._28_4_ = auVar105._12_4_;
      auVar46._4_4_ = fVar141 * fVar127;
      auVar46._0_4_ = fVar138 * fVar91;
      auVar46._8_4_ = fVar142 * fVar165;
      auVar46._12_4_ = fVar145 * fVar174;
      auVar46._16_4_ = fVar147 * fVar14;
      auVar46._20_4_ = fVar149 * fVar19;
      auVar46._24_4_ = fVar151 * fVar24;
      auVar46._28_4_ = auVar119._12_4_;
      uVar3 = *(undefined4 *)(ray + k * 4);
      auVar181._4_4_ = uVar3;
      auVar181._0_4_ = uVar3;
      auVar181._8_4_ = uVar3;
      auVar181._12_4_ = uVar3;
      auVar181._16_4_ = uVar3;
      auVar181._20_4_ = uVar3;
      auVar181._24_4_ = uVar3;
      auVar181._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar190._4_4_ = uVar3;
      auVar190._0_4_ = uVar3;
      auVar190._8_4_ = uVar3;
      auVar190._12_4_ = uVar3;
      auVar190._16_4_ = uVar3;
      auVar190._20_4_ = uVar3;
      auVar190._24_4_ = uVar3;
      auVar190._28_4_ = uVar3;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar191._4_4_ = uVar5;
      auVar191._0_4_ = uVar5;
      auVar191._8_4_ = uVar5;
      auVar191._12_4_ = uVar5;
      auVar191._16_4_ = uVar5;
      auVar191._20_4_ = uVar5;
      auVar191._24_4_ = uVar5;
      auVar191._28_4_ = uVar5;
      fVar78 = *(float *)(ray + k * 4 + 0x50);
      local_28e0 = vsubps_avx(auVar46,auVar45);
      in_ZMM5 = ZEXT3264(local_28e0);
      local_2880 = vsubps_avx(auVar122,auVar181);
      fVar89 = *(float *)(ray + k * 4 + 0x60);
      auVar110 = vsubps_avx(auVar130,auVar190);
      auVar29 = vsubps_avx(auVar161,auVar191);
      fVar128 = auVar29._0_4_;
      fVar132 = auVar29._4_4_;
      auVar47._4_4_ = fVar132 * fVar78;
      auVar47._0_4_ = fVar128 * fVar78;
      fVar133 = auVar29._8_4_;
      auVar47._8_4_ = fVar133 * fVar78;
      fVar134 = auVar29._12_4_;
      auVar47._12_4_ = fVar134 * fVar78;
      fVar135 = auVar29._16_4_;
      auVar47._16_4_ = fVar135 * fVar78;
      fVar136 = auVar29._20_4_;
      auVar47._20_4_ = fVar136 * fVar78;
      fVar137 = auVar29._24_4_;
      auVar47._24_4_ = fVar137 * fVar78;
      auVar47._28_4_ = fVar144;
      fVar93 = auVar110._0_4_;
      fVar144 = auVar110._4_4_;
      auVar48._4_4_ = fVar89 * fVar144;
      auVar48._0_4_ = fVar89 * fVar93;
      fVar168 = auVar110._8_4_;
      auVar48._8_4_ = fVar89 * fVar168;
      fVar178 = auVar110._12_4_;
      auVar48._12_4_ = fVar89 * fVar178;
      fVar16 = auVar110._16_4_;
      auVar48._16_4_ = fVar89 * fVar16;
      fVar21 = auVar110._20_4_;
      auVar48._20_4_ = fVar89 * fVar21;
      fVar26 = auVar110._24_4_;
      auVar48._24_4_ = fVar89 * fVar26;
      auVar48._28_4_ = uVar3;
      auVar110 = vsubps_avx(auVar48,auVar47);
      fVar90 = *(float *)(ray + k * 4 + 0x40);
      fVar94 = local_2880._0_4_;
      fVar163 = local_2880._4_4_;
      auVar49._4_4_ = fVar89 * fVar163;
      auVar49._0_4_ = fVar89 * fVar94;
      fVar170 = local_2880._8_4_;
      auVar49._8_4_ = fVar89 * fVar170;
      fVar4 = local_2880._12_4_;
      auVar49._12_4_ = fVar89 * fVar4;
      fVar17 = local_2880._16_4_;
      auVar49._16_4_ = fVar89 * fVar17;
      fVar22 = local_2880._20_4_;
      auVar49._20_4_ = fVar89 * fVar22;
      fVar27 = local_2880._24_4_;
      auVar49._24_4_ = fVar89 * fVar27;
      auVar49._28_4_ = uVar5;
      auVar50._4_4_ = fVar132 * fVar90;
      auVar50._0_4_ = fVar128 * fVar90;
      auVar50._8_4_ = fVar133 * fVar90;
      auVar50._12_4_ = fVar134 * fVar90;
      auVar50._16_4_ = fVar135 * fVar90;
      auVar50._20_4_ = fVar136 * fVar90;
      auVar50._24_4_ = fVar137 * fVar90;
      auVar50._28_4_ = auVar123._12_4_;
      auVar29 = vsubps_avx(auVar50,auVar49);
      auVar51._4_4_ = fVar90 * fVar144;
      auVar51._0_4_ = fVar90 * fVar93;
      auVar51._8_4_ = fVar90 * fVar168;
      auVar51._12_4_ = fVar90 * fVar178;
      auVar51._16_4_ = fVar90 * fVar16;
      auVar51._20_4_ = fVar90 * fVar21;
      auVar51._24_4_ = fVar90 * fVar26;
      auVar51._28_4_ = uVar5;
      auVar52._4_4_ = fVar163 * fVar78;
      auVar52._0_4_ = fVar94 * fVar78;
      auVar52._8_4_ = fVar170 * fVar78;
      auVar52._12_4_ = fVar4 * fVar78;
      auVar52._16_4_ = fVar17 * fVar78;
      auVar52._20_4_ = fVar22 * fVar78;
      auVar52._24_4_ = fVar27 * fVar78;
      auVar52._28_4_ = local_2880._28_4_;
      auVar33 = vsubps_avx(auVar52,auVar51);
      local_2860._0_4_ = auVar96._0_4_;
      local_2860._4_4_ = auVar96._4_4_;
      fStack_2858 = auVar96._8_4_;
      fStack_2854 = auVar96._12_4_;
      fStack_2850 = auVar96._16_4_;
      fStack_284c = auVar96._20_4_;
      fStack_2848 = auVar96._24_4_;
      uStack_2844 = auVar96._28_4_;
      local_2600 = local_28e0._0_4_;
      fStack_25fc = local_28e0._4_4_;
      fStack_25f8 = local_28e0._8_4_;
      fStack_25f4 = local_28e0._12_4_;
      fStack_25f0 = local_28e0._16_4_;
      fStack_25ec = local_28e0._20_4_;
      fStack_25e8 = local_28e0._24_4_;
      fVar103 = local_2640._0_4_;
      fVar164 = local_2640._4_4_;
      fVar172 = local_2640._8_4_;
      fVar13 = local_2640._12_4_;
      fVar18 = local_2640._16_4_;
      fVar23 = local_2640._20_4_;
      fVar28 = local_2640._24_4_;
      auVar83._0_4_ = fVar90 * fVar103 + fVar89 * local_2600 + (float)local_2860._0_4_ * fVar78;
      auVar83._4_4_ = fVar90 * fVar164 + fVar89 * fStack_25fc + (float)local_2860._4_4_ * fVar78;
      auVar83._8_4_ = fVar90 * fVar172 + fVar89 * fStack_25f8 + fStack_2858 * fVar78;
      auVar83._12_4_ = fVar90 * fVar13 + fVar89 * fStack_25f4 + fStack_2854 * fVar78;
      auVar83._16_4_ = fVar90 * fVar18 + fVar89 * fStack_25f0 + fStack_2850 * fVar78;
      auVar83._20_4_ = fVar90 * fVar23 + fVar89 * fStack_25ec + fStack_284c * fVar78;
      auVar83._24_4_ = fVar90 * fVar28 + fVar89 * fStack_25e8 + fStack_2848 * fVar78;
      auVar83._28_4_ = fVar89 + fVar89 + fVar78;
      auVar108._8_4_ = 0x80000000;
      auVar108._0_8_ = 0x8000000080000000;
      auVar108._12_4_ = 0x80000000;
      auVar108._16_4_ = 0x80000000;
      auVar108._20_4_ = 0x80000000;
      auVar108._24_4_ = 0x80000000;
      auVar108._28_4_ = 0x80000000;
      auVar96 = vandps_avx(auVar83,auVar108);
      uVar67 = auVar96._0_4_;
      local_26c0._0_4_ =
           (float)(uVar67 ^ (uint)(fVar138 * auVar110._0_4_ +
                                  fVar167 * auVar33._0_4_ + fVar154 * auVar29._0_4_));
      uVar57 = auVar96._4_4_;
      local_26c0._4_4_ =
           (float)(uVar57 ^ (uint)(fVar141 * auVar110._4_4_ +
                                  fVar169 * auVar33._4_4_ + fVar155 * auVar29._4_4_));
      uVar143 = auVar96._8_4_;
      local_26c0._8_4_ =
           (float)(uVar143 ^
                  (uint)(fVar142 * auVar110._8_4_ +
                        fVar171 * auVar33._8_4_ + fVar156 * auVar29._8_4_));
      uVar146 = auVar96._12_4_;
      local_26c0._12_4_ =
           (float)(uVar146 ^
                  (uint)(fVar145 * auVar110._12_4_ +
                        fVar173 * auVar33._12_4_ + fVar157 * auVar29._12_4_));
      uVar148 = auVar96._16_4_;
      local_26c0._16_4_ =
           (float)(uVar148 ^
                  (uint)(fVar147 * auVar110._16_4_ +
                        fVar175 * auVar33._16_4_ + fVar158 * auVar29._16_4_));
      uVar150 = auVar96._20_4_;
      local_26c0._20_4_ =
           (float)(uVar150 ^
                  (uint)(fVar149 * auVar110._20_4_ +
                        fVar177 * auVar33._20_4_ + fVar159 * auVar29._20_4_));
      uVar152 = auVar96._24_4_;
      local_26c0._24_4_ =
           (float)(uVar152 ^
                  (uint)(fVar151 * auVar110._24_4_ +
                        fVar179 * auVar33._24_4_ + fVar160 * auVar29._24_4_));
      uVar153 = auVar96._28_4_;
      local_26c0._28_4_ =
           (float)(uVar153 ^ (uint)(auVar30._28_4_ + auVar32._28_4_ + auVar31._28_4_));
      auVar113 = ZEXT3264(local_26c0);
      local_26a0._0_4_ =
           (float)(uVar67 ^ (uint)(auVar110._0_4_ * fVar180 +
                                  fVar92 * auVar33._0_4_ + fVar91 * auVar29._0_4_));
      local_26a0._4_4_ =
           (float)(uVar57 ^ (uint)(auVar110._4_4_ * fVar183 +
                                  fVar162 * auVar33._4_4_ + fVar127 * auVar29._4_4_));
      local_26a0._8_4_ =
           (float)(uVar143 ^
                  (uint)(auVar110._8_4_ * fVar184 +
                        fVar166 * auVar33._8_4_ + fVar165 * auVar29._8_4_));
      local_26a0._12_4_ =
           (float)(uVar146 ^
                  (uint)(auVar110._12_4_ * fVar185 +
                        fVar176 * auVar33._12_4_ + fVar174 * auVar29._12_4_));
      local_26a0._16_4_ =
           (float)(uVar148 ^
                  (uint)(auVar110._16_4_ * fVar186 +
                        fVar15 * auVar33._16_4_ + fVar14 * auVar29._16_4_));
      local_26a0._20_4_ =
           (float)(uVar150 ^
                  (uint)(auVar110._20_4_ * fVar187 +
                        fVar20 * auVar33._20_4_ + fVar19 * auVar29._20_4_));
      local_26a0._24_4_ =
           (float)(uVar152 ^
                  (uint)(auVar110._24_4_ * fVar188 +
                        fVar25 * auVar33._24_4_ + fVar24 * auVar29._24_4_));
      local_26a0._28_4_ = (float)(uVar153 ^ (uint)(auVar33._28_4_ + auVar29._28_4_ + -0.0));
      in_ZMM4 = ZEXT3264(local_26a0);
      auVar110 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar96 = vcmpps_avx(local_26c0,auVar110,5);
      auVar110 = vcmpps_avx(local_26a0,auVar110,5);
      auVar96 = vandps_avx(auVar96,auVar110);
      auVar109._8_4_ = 0x7fffffff;
      auVar109._0_8_ = 0x7fffffff7fffffff;
      auVar109._12_4_ = 0x7fffffff;
      auVar109._16_4_ = 0x7fffffff;
      auVar109._20_4_ = 0x7fffffff;
      auVar109._24_4_ = 0x7fffffff;
      auVar109._28_4_ = 0x7fffffff;
      local_2660 = vandps_avx(auVar83,auVar109);
      auVar110 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar83,4);
      auVar96 = vandps_avx(auVar96,auVar110);
      auVar84._0_4_ = local_26c0._0_4_ + local_26a0._0_4_;
      auVar84._4_4_ = local_26c0._4_4_ + local_26a0._4_4_;
      auVar84._8_4_ = local_26c0._8_4_ + local_26a0._8_4_;
      auVar84._12_4_ = local_26c0._12_4_ + local_26a0._12_4_;
      auVar84._16_4_ = local_26c0._16_4_ + local_26a0._16_4_;
      auVar84._20_4_ = local_26c0._20_4_ + local_26a0._20_4_;
      auVar84._24_4_ = local_26c0._24_4_ + local_26a0._24_4_;
      auVar84._28_4_ = local_26c0._28_4_ + local_26a0._28_4_;
      auVar110 = vcmpps_avx(auVar84,local_2660,2);
      auVar29 = auVar110 & auVar96;
      if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar29 >> 0x7f,0) != '\0') ||
            (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar29 >> 0xbf,0) != '\0') ||
          (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar29[0x1f] < '\0') {
        auVar96 = vandps_avx(auVar96,auVar110);
        auVar104 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        local_2680._0_4_ =
             (float)(uVar67 ^ (uint)(fVar103 * fVar94 +
                                    (float)local_2860._0_4_ * fVar93 + fVar128 * local_2600));
        local_2680._4_4_ =
             (float)(uVar57 ^ (uint)(fVar164 * fVar163 +
                                    (float)local_2860._4_4_ * fVar144 + fVar132 * fStack_25fc));
        local_2680._8_4_ =
             (float)(uVar143 ^
                    (uint)(fVar172 * fVar170 + fStack_2858 * fVar168 + fVar133 * fStack_25f8));
        local_2680._12_4_ =
             (float)(uVar146 ^
                    (uint)(fVar13 * fVar4 + fStack_2854 * fVar178 + fVar134 * fStack_25f4));
        local_2680._16_4_ =
             (float)(uVar148 ^
                    (uint)(fVar18 * fVar17 + fStack_2850 * fVar16 + fVar135 * fStack_25f0));
        local_2680._20_4_ =
             (float)(uVar150 ^
                    (uint)(fVar23 * fVar22 + fStack_284c * fVar21 + fVar136 * fStack_25ec));
        local_2680._24_4_ =
             (float)(uVar152 ^
                    (uint)(fVar28 * fVar27 + fStack_2848 * fVar26 + fVar137 * fStack_25e8));
        local_2680._28_4_ = uVar153 ^ 0x7fc00000;
        fVar78 = *(float *)(ray + k * 4 + 0x30);
        fVar89 = local_2660._0_4_;
        fVar90 = local_2660._4_4_;
        auVar53._4_4_ = fVar90 * fVar78;
        auVar53._0_4_ = fVar89 * fVar78;
        fVar91 = local_2660._8_4_;
        auVar53._8_4_ = fVar91 * fVar78;
        fVar92 = local_2660._12_4_;
        auVar53._12_4_ = fVar92 * fVar78;
        fVar93 = local_2660._16_4_;
        auVar53._16_4_ = fVar93 * fVar78;
        fVar94 = local_2660._20_4_;
        auVar53._20_4_ = fVar94 * fVar78;
        fVar127 = local_2660._24_4_;
        auVar53._24_4_ = fVar127 * fVar78;
        auVar53._28_4_ = fVar78;
        auVar96 = vcmpps_avx(auVar53,local_2680,1);
        fVar78 = *(float *)(ray + k * 4 + 0x80);
        auVar88 = ZEXT3264(CONCAT428(fVar78,CONCAT424(fVar78,CONCAT420(fVar78,CONCAT416(fVar78,
                                                  CONCAT412(fVar78,CONCAT48(fVar78,CONCAT44(fVar78,
                                                  fVar78))))))));
        auVar54._4_4_ = fVar78 * fVar90;
        auVar54._0_4_ = fVar78 * fVar89;
        auVar54._8_4_ = fVar78 * fVar91;
        auVar54._12_4_ = fVar78 * fVar92;
        auVar54._16_4_ = fVar78 * fVar93;
        auVar54._20_4_ = fVar78 * fVar94;
        auVar54._24_4_ = fVar78 * fVar127;
        auVar54._28_4_ = 0x7fffffff;
        auVar110 = vcmpps_avx(local_2680,auVar54,2);
        auVar96 = vandps_avx(auVar96,auVar110);
        auVar95 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        auVar104 = vpand_avx(auVar95,auVar104);
        auVar95 = vpmovzxwd_avx(auVar104);
        auVar129 = vpslld_avx(auVar95,0x1f);
        auVar80 = vpsrad_avx(auVar129,0x1f);
        auVar95 = vpunpckhwd_avx(auVar104,auVar104);
        auVar95 = vpslld_avx(auVar95,0x1f);
        auVar95 = vpsrad_avx(auVar95,0x1f);
        local_2840._16_16_ = auVar95;
        local_2840._0_16_ = auVar80;
        in_ZMM5 = ZEXT3264(local_2840);
        if ((((((((local_2840 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_2840 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_2840 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_2840 >> 0x7f,0) != '\0') ||
              (local_2840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar95 >> 0x3f,0) != '\0') ||
            (local_2840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar95[0xf] < '\0') {
          local_2620 = (float)local_2860._0_4_;
          fStack_261c = (float)local_2860._4_4_;
          fStack_2618 = fStack_2858;
          fStack_2614 = fStack_2854;
          fStack_2610 = fStack_2850;
          fStack_260c = fStack_284c;
          fStack_2608 = fStack_2848;
          uStack_2604 = uStack_2844;
          uStack_25e4 = local_28e0._28_4_;
          local_25e0 = local_2840;
          local_2500 = local_24c0;
          auVar110 = vrcpps_avx(local_2660);
          fVar78 = auVar110._0_4_;
          auVar99._0_4_ = fVar89 * fVar78;
          fVar89 = auVar110._4_4_;
          auVar99._4_4_ = fVar90 * fVar89;
          fVar90 = auVar110._8_4_;
          auVar99._8_4_ = fVar91 * fVar90;
          fVar91 = auVar110._12_4_;
          auVar99._12_4_ = fVar92 * fVar91;
          fVar92 = auVar110._16_4_;
          auVar99._16_4_ = fVar93 * fVar92;
          fVar93 = auVar110._20_4_;
          auVar99._20_4_ = fVar94 * fVar93;
          fVar94 = auVar110._24_4_;
          auVar99._24_4_ = fVar127 * fVar94;
          auVar99._28_4_ = 0;
          auVar125._8_4_ = 0x3f800000;
          auVar125._0_8_ = 0x3f8000003f800000;
          auVar125._12_4_ = 0x3f800000;
          auVar125._16_4_ = 0x3f800000;
          auVar125._20_4_ = 0x3f800000;
          auVar125._24_4_ = 0x3f800000;
          auVar125._28_4_ = 0x3f800000;
          auVar29 = vsubps_avx(auVar125,auVar99);
          fVar78 = fVar78 + fVar78 * auVar29._0_4_;
          fVar89 = fVar89 + fVar89 * auVar29._4_4_;
          fVar90 = fVar90 + fVar90 * auVar29._8_4_;
          fVar91 = fVar91 + fVar91 * auVar29._12_4_;
          fVar92 = fVar92 + fVar92 * auVar29._16_4_;
          fVar93 = fVar93 + fVar93 * auVar29._20_4_;
          fVar94 = fVar94 + fVar94 * auVar29._24_4_;
          local_2580._4_4_ = local_2680._4_4_ * fVar89;
          local_2580._0_4_ = local_2680._0_4_ * fVar78;
          local_2580._8_4_ = local_2680._8_4_ * fVar90;
          local_2580._12_4_ = local_2680._12_4_ * fVar91;
          local_2580._16_4_ = local_2680._16_4_ * fVar92;
          local_2580._20_4_ = local_2680._20_4_ * fVar93;
          local_2580._24_4_ = local_2680._24_4_ * fVar94;
          local_2580._28_4_ = local_2680._28_4_;
          auVar126 = ZEXT3264(local_2580);
          auVar55._4_4_ = fVar89 * local_26c0._4_4_;
          auVar55._0_4_ = fVar78 * local_26c0._0_4_;
          auVar55._8_4_ = fVar90 * local_26c0._8_4_;
          auVar55._12_4_ = fVar91 * local_26c0._12_4_;
          auVar55._16_4_ = fVar92 * local_26c0._16_4_;
          auVar55._20_4_ = fVar93 * local_26c0._20_4_;
          auVar55._24_4_ = fVar94 * local_26c0._24_4_;
          auVar55._28_4_ = auVar29._28_4_;
          auVar96 = vminps_avx(auVar55,auVar125);
          auVar56._4_4_ = fVar89 * local_26a0._4_4_;
          auVar56._0_4_ = fVar78 * local_26a0._0_4_;
          auVar56._8_4_ = fVar90 * local_26a0._8_4_;
          auVar56._12_4_ = fVar91 * local_26a0._12_4_;
          auVar56._16_4_ = fVar92 * local_26a0._16_4_;
          auVar56._20_4_ = fVar93 * local_26a0._20_4_;
          auVar56._24_4_ = fVar94 * local_26a0._24_4_;
          auVar56._28_4_ = auVar110._28_4_ + auVar29._28_4_;
          auVar110 = vminps_avx(auVar56,auVar125);
          auVar29 = vsubps_avx(auVar125,auVar96);
          auVar30 = vsubps_avx(auVar125,auVar110);
          local_25a0 = vblendvps_avx(auVar110,auVar29,local_24c0);
          local_25c0 = vblendvps_avx(auVar96,auVar30,local_24c0);
          local_2560[0] = fVar103 * (float)local_24e0._0_4_;
          local_2560[1] = fVar164 * (float)local_24e0._4_4_;
          local_2560[2] = fVar172 * fStack_24d8;
          local_2560[3] = fVar13 * fStack_24d4;
          fStack_2550 = fVar18 * fStack_24d0;
          fStack_254c = fVar23 * fStack_24cc;
          fStack_2548 = fVar28 * fStack_24c8;
          uStack_2544 = local_25c0._28_4_;
          local_2540[0] = (float)local_2860._0_4_ * (float)local_24e0._0_4_;
          local_2540[1] = (float)local_2860._4_4_ * (float)local_24e0._4_4_;
          local_2540[2] = fStack_2858 * fStack_24d8;
          local_2540[3] = fStack_2854 * fStack_24d4;
          fStack_2530 = fStack_2850 * fStack_24d0;
          fStack_252c = fStack_284c * fStack_24cc;
          fStack_2528 = fStack_2848 * fStack_24c8;
          uStack_2524 = auVar96._28_4_;
          local_2520[0] = local_2600 * (float)local_24e0._0_4_;
          local_2520[1] = fStack_25fc * (float)local_24e0._4_4_;
          local_2520[2] = fStack_25f8 * fStack_24d8;
          local_2520[3] = fStack_25f4 * fStack_24d4;
          fStack_2510 = fStack_25f0 * fStack_24d0;
          fStack_250c = fStack_25ec * fStack_24cc;
          fStack_2508 = fStack_25e8 * fStack_24c8;
          uStack_2504 = uStack_24c4;
          auVar95 = vpunpckhwd_avx(auVar104,auVar104);
          auVar95 = vpslld_avx(auVar95,0x1f);
          auVar85._16_16_ = auVar95;
          auVar85._0_16_ = auVar129;
          auVar100._8_4_ = 0x7f800000;
          auVar100._0_8_ = 0x7f8000007f800000;
          auVar100._12_4_ = 0x7f800000;
          auVar100._16_4_ = 0x7f800000;
          auVar100._20_4_ = 0x7f800000;
          auVar100._24_4_ = 0x7f800000;
          auVar100._28_4_ = 0x7f800000;
          auVar96 = vblendvps_avx(auVar100,local_2580,auVar85);
          auVar110 = vshufps_avx(auVar96,auVar96,0xb1);
          auVar110 = vminps_avx(auVar96,auVar110);
          auVar29 = vshufpd_avx(auVar110,auVar110,5);
          auVar110 = vminps_avx(auVar110,auVar29);
          auVar29 = vperm2f128_avx(auVar110,auVar110,1);
          auVar110 = vminps_avx(auVar110,auVar29);
          auVar96 = vcmpps_avx(auVar96,auVar110,0);
          auVar95 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
          auVar104 = vpand_avx(auVar95,auVar104);
          auVar95 = vpmovzxwd_avx(auVar104);
          auVar95 = vpslld_avx(auVar95,0x1f);
          auVar95 = vpsrad_avx(auVar95,0x1f);
          auVar104 = vpunpckhwd_avx(auVar104,auVar104);
          auVar104 = vpslld_avx(auVar104,0x1f);
          auVar104 = vpsrad_avx(auVar104,0x1f);
          auVar86._16_16_ = auVar104;
          auVar86._0_16_ = auVar95;
          if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar86 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar86 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar86 >> 0x7f,0) == '\0') &&
                (auVar86 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar104 >> 0x3f,0) == '\0') &&
              (auVar86 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar104[0xf]) {
            auVar86 = local_2840;
          }
          uVar57 = vmovmskps_avx(auVar86);
          uVar67 = 0;
          if (uVar57 != 0) {
            for (; (uVar57 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
            }
          }
LAB_010026f7:
          auVar113 = ZEXT3264(auVar30);
          uVar75 = CONCAT44(0,uVar67);
          uVar67 = *(uint *)((long)&local_23c0 + uVar75 * 4);
          pGVar9 = (pSVar7->geometries).items[uVar67].ptr;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_2840 + uVar75 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar3 = *(undefined4 *)(local_25c0 + uVar75 * 4);
              uVar5 = *(undefined4 *)(local_25a0 + uVar75 * 4);
              *(float *)(ray + k * 4 + 0x80) = local_2560[uVar75 - 8];
              *(float *)(ray + k * 4 + 0xc0) = local_2560[uVar75];
              *(float *)(ray + k * 4 + 0xd0) = local_2540[uVar75];
              *(float *)(ray + k * 4 + 0xe0) = local_2520[uVar75];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar3;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_2780 + uVar75 * 4)
              ;
              *(uint *)(ray + k * 4 + 0x120) = uVar67;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              goto LAB_01002485;
            }
            _local_2860 = auVar126._0_32_;
            uVar3 = *(undefined4 *)(local_25c0 + uVar75 * 4);
            local_2720._4_4_ = uVar3;
            local_2720._0_4_ = uVar3;
            local_2720._8_4_ = uVar3;
            local_2720._12_4_ = uVar3;
            local_2710 = *(undefined4 *)(local_25a0 + uVar75 * 4);
            local_26f0 = vpshufd_avx(ZEXT416(uVar67),0);
            uVar3 = *(undefined4 *)((long)&local_2780 + uVar75 * 4);
            local_2700._4_4_ = uVar3;
            local_2700._0_4_ = uVar3;
            local_2700._8_4_ = uVar3;
            local_2700._12_4_ = uVar3;
            auVar113 = ZEXT1664(local_2700);
            fVar78 = local_2560[uVar75];
            auVar115._4_4_ = fVar78;
            auVar115._0_4_ = fVar78;
            auVar115._8_4_ = fVar78;
            auVar115._12_4_ = fVar78;
            in_ZMM4 = ZEXT1664(auVar115);
            fVar89 = local_2540[uVar75];
            local_2740._4_4_ = fVar89;
            local_2740._0_4_ = fVar89;
            local_2740._8_4_ = fVar89;
            local_2740._12_4_ = fVar89;
            in_ZMM5 = ZEXT1664(local_2740);
            fVar89 = local_2520[uVar75];
            local_2730._4_4_ = fVar89;
            local_2730._0_4_ = fVar89;
            local_2730._8_4_ = fVar89;
            local_2730._12_4_ = fVar89;
            local_2750[0] = (RTCHitN)SUB41(fVar78,0);
            local_2750[1] = (RTCHitN)(char)((uint)fVar78 >> 8);
            local_2750[2] = (RTCHitN)(char)((uint)fVar78 >> 0x10);
            local_2750[3] = (RTCHitN)(char)((uint)fVar78 >> 0x18);
            local_2750[4] = (RTCHitN)SUB41(fVar78,0);
            local_2750[5] = (RTCHitN)(char)((uint)fVar78 >> 8);
            local_2750[6] = (RTCHitN)(char)((uint)fVar78 >> 0x10);
            local_2750[7] = (RTCHitN)(char)((uint)fVar78 >> 0x18);
            local_2750[8] = (RTCHitN)SUB41(fVar78,0);
            local_2750[9] = (RTCHitN)(char)((uint)fVar78 >> 8);
            local_2750[10] = (RTCHitN)(char)((uint)fVar78 >> 0x10);
            local_2750[0xb] = (RTCHitN)(char)((uint)fVar78 >> 0x18);
            local_2750[0xc] = (RTCHitN)SUB41(fVar78,0);
            local_2750[0xd] = (RTCHitN)(char)((uint)fVar78 >> 8);
            local_2750[0xe] = (RTCHitN)(char)((uint)fVar78 >> 0x10);
            local_2750[0xf] = (RTCHitN)(char)((uint)fVar78 >> 0x18);
            uStack_270c = local_2710;
            uStack_2708 = local_2710;
            uStack_2704 = local_2710;
            vcmpps_avx(ZEXT1632(local_2720),ZEXT1632(local_2720),0xf);
            uStack_26dc = context->user->instID[0];
            local_26e0 = uStack_26dc;
            uStack_26d8 = uStack_26dc;
            uStack_26d4 = uStack_26dc;
            uStack_26d0 = context->user->instPrimID[0];
            uStack_26cc = uStack_26d0;
            uStack_26c8 = uStack_26d0;
            uStack_26c4 = uStack_26d0;
            local_28e0._0_8_ = uVar75;
            *(float *)(ray + k * 4 + 0x80) = local_2560[uVar75 - 8];
            local_2950 = *local_2940;
            local_28b0.valid = (int *)local_2950;
            local_28b0.geometryUserPtr = pGVar9->userPtr;
            local_28b0.context = context->user;
            local_28b0.hit = local_2750;
            local_28b0.N = 4;
            local_2880._0_8_ = pGVar9;
            local_28b0.ray = (RTCRayN *)ray;
            if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              auVar113 = ZEXT1664(local_2700);
              in_ZMM4 = ZEXT1664(auVar115);
              in_ZMM5 = ZEXT1664(local_2740);
              (*pGVar9->intersectionFilterN)(&local_28b0);
            }
            if (local_2950 == (undefined1  [16])0x0) {
              auVar104 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar104 = auVar104 ^ _DAT_01f46b70;
            }
            else {
              p_Var12 = context->args->filter;
              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT ||
                  ((*(byte *)(local_2880._0_8_ + 0x3e) & 0x40) != 0)))) {
                auVar113 = ZEXT1664(auVar113._0_16_);
                in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                (*p_Var12)(&local_28b0);
              }
              auVar95 = vpcmpeqd_avx(local_2950,_DAT_01f45a50);
              auVar104 = auVar95 ^ _DAT_01f46b70;
              if (local_2950 != (undefined1  [16])0x0) {
                auVar95 = auVar95 ^ _DAT_01f46b70;
                auVar80 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])local_28b0.hit);
                *(undefined1 (*) [16])(local_28b0.ray + 0xc0) = auVar80;
                auVar80 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_28b0.hit + 0x10));
                *(undefined1 (*) [16])(local_28b0.ray + 0xd0) = auVar80;
                auVar80 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_28b0.hit + 0x20));
                *(undefined1 (*) [16])(local_28b0.ray + 0xe0) = auVar80;
                auVar80 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_28b0.hit + 0x30));
                *(undefined1 (*) [16])(local_28b0.ray + 0xf0) = auVar80;
                auVar80 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_28b0.hit + 0x40));
                *(undefined1 (*) [16])(local_28b0.ray + 0x100) = auVar80;
                auVar80 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_28b0.hit + 0x50));
                *(undefined1 (*) [16])(local_28b0.ray + 0x110) = auVar80;
                auVar80 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_28b0.hit + 0x60));
                *(undefined1 (*) [16])(local_28b0.ray + 0x120) = auVar80;
                auVar80 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_28b0.hit + 0x70));
                *(undefined1 (*) [16])(local_28b0.ray + 0x130) = auVar80;
                auVar95 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_28b0.hit + 0x80));
                *(undefined1 (*) [16])(local_28b0.ray + 0x140) = auVar95;
              }
            }
            auVar81._8_8_ = 0x100000001;
            auVar81._0_8_ = 0x100000001;
            if ((auVar81 & auVar104) == (undefined1  [16])0x0) {
              local_29a0._0_4_ = auVar88._0_4_;
              *(undefined4 *)(ray + k * 4 + 0x80) = local_29a0._0_4_;
              local_29a0 = auVar88._0_32_;
            }
            else {
              local_29a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_2840 + local_28e0._0_8_ * 4) = 0;
            auVar88 = ZEXT3264(local_29a0);
            auVar104 = vshufps_avx(local_29a0._0_16_,local_29a0._0_16_,0);
            auVar87._16_16_ = auVar104;
            auVar87._0_16_ = auVar104;
            auVar126 = ZEXT3264(_local_2860);
            auVar96 = vcmpps_avx(_local_2860,auVar87,2);
            local_2840 = vandps_avx(auVar96,local_2840);
          }
          if ((((((((local_2840 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_2840 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_2840 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_2840 >> 0x7f,0) == '\0') &&
                (local_2840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_2840 >> 0xbf,0) == '\0') &&
              (local_2840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_2840[0x1f]) goto LAB_01002485;
          auVar101._8_4_ = 0x7f800000;
          auVar101._0_8_ = 0x7f8000007f800000;
          auVar101._12_4_ = 0x7f800000;
          auVar101._16_4_ = 0x7f800000;
          auVar101._20_4_ = 0x7f800000;
          auVar101._24_4_ = 0x7f800000;
          auVar101._28_4_ = 0x7f800000;
          auVar96 = vblendvps_avx(auVar101,auVar126._0_32_,local_2840);
          auVar110 = vshufps_avx(auVar96,auVar96,0xb1);
          auVar110 = vminps_avx(auVar96,auVar110);
          auVar29 = vshufpd_avx(auVar110,auVar110,5);
          auVar110 = vminps_avx(auVar110,auVar29);
          auVar30 = vperm2f128_avx(auVar110,auVar110,1);
          auVar110 = vminps_avx(auVar110,auVar30);
          auVar110 = vcmpps_avx(auVar96,auVar110,0);
          auVar29 = local_2840 & auVar110;
          auVar96 = local_2840;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0x7f,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0xbf,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar29[0x1f] < '\0') {
            auVar96 = vandps_avx(auVar110,local_2840);
          }
          uVar57 = vmovmskps_avx(auVar96);
          uVar67 = 0;
          if (uVar57 != 0) {
            for (; (uVar57 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
            }
          }
          goto LAB_010026f7;
        }
      }
LAB_01002485:
      auVar126 = ZEXT3264(local_23e0);
      auVar131 = ZEXT3264(local_2400);
      auVar140 = ZEXT3264(local_2420);
      auVar182 = ZEXT3264(local_24a0);
      uVar75 = local_2938;
      fVar78 = local_2440;
      fVar91 = fStack_243c;
      fVar92 = fStack_2438;
      fVar93 = fStack_2434;
      fVar94 = fStack_2430;
      fVar103 = fStack_242c;
      fVar127 = fStack_2428;
      fVar89 = local_2460;
      fVar162 = fStack_245c;
      fVar144 = fStack_2458;
      fVar163 = fStack_2454;
      fVar164 = fStack_2450;
      fVar165 = fStack_244c;
      fVar166 = fStack_2448;
      fVar90 = local_2480;
      fVar168 = fStack_247c;
      fVar170 = fStack_2478;
      fVar172 = fStack_2474;
      fVar174 = fStack_2470;
      fVar176 = fStack_246c;
      fVar178 = fStack_2468;
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar88 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }